

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynClassElements * ParseClassElements(ParseContext *ctx)

{
  Lexeme *begin;
  SynConstantSet *pSVar1;
  SynVariableDefinitions *pSVar2;
  SynClassStaticIf *pSVar3;
  SynAccessor *pSVar4;
  SynFunctionDefinition *pSVar5;
  SynTypedef *pSVar6;
  int iVar7;
  SynTypedef *pSVar8;
  SynClassStaticIf *pSVar9;
  SynFunctionDefinition *pSVar10;
  SynAccessor *pSVar11;
  SynVariableDefinitions *pSVar12;
  SynConstantSet *pSVar13;
  Lexeme *end;
  undefined4 extraout_var;
  IntrusiveList<SynConstantSet> constantSets;
  IntrusiveList<SynVariableDefinitions> members;
  IntrusiveList<SynClassStaticIf> staticIfs;
  IntrusiveList<SynAccessor> accessors;
  IntrusiveList<SynFunctionDefinition> functions;
  IntrusiveList<SynTypedef> typedefs;
  SynClassElements *this;
  
  begin = ctx->currentLexeme;
  typedefs.head = (SynTypedef *)0x0;
  typedefs.tail = (SynTypedef *)0x0;
  functions.head = (SynFunctionDefinition *)0x0;
  functions.tail = (SynFunctionDefinition *)0x0;
  accessors.head = (SynAccessor *)0x0;
  accessors.tail = (SynAccessor *)0x0;
  members.head = (SynVariableDefinitions *)0x0;
  members.tail = (SynVariableDefinitions *)0x0;
  constantSets.head = (SynConstantSet *)0x0;
  constantSets.tail = (SynConstantSet *)0x0;
  staticIfs.head = (SynClassStaticIf *)0x0;
  staticIfs.tail = (SynClassStaticIf *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              pSVar8 = ParseTypedef(ctx);
              if (pSVar8 == (SynTypedef *)0x0) break;
              IntrusiveList<SynTypedef>::push_back(&typedefs,pSVar8);
            }
            pSVar9 = ParseClassStaticIf(ctx,false);
            if (pSVar9 == (SynClassStaticIf *)0x0) break;
            IntrusiveList<SynClassStaticIf>::push_back(&staticIfs,pSVar9);
          }
          pSVar10 = ParseFunctionDefinition(ctx);
          if (pSVar10 == (SynFunctionDefinition *)0x0) break;
          IntrusiveList<SynFunctionDefinition>::push_back(&functions,pSVar10);
        }
        pSVar11 = ParseAccessorDefinition(ctx);
        if (pSVar11 == (SynAccessor *)0x0) break;
        IntrusiveList<SynAccessor>::push_back(&accessors,pSVar11);
      }
      pSVar12 = ParseVariableDefinitions(ctx,true);
      if (pSVar12 == (SynVariableDefinitions *)0x0) break;
      IntrusiveList<SynVariableDefinitions>::push_back(&members,pSVar12);
    }
    pSVar13 = ParseConstantSet(ctx);
    if (pSVar13 == (SynConstantSet *)0x0) break;
    IntrusiveList<SynConstantSet>::push_back(&constantSets,pSVar13);
  }
  end = begin;
  if (begin != ctx->currentLexeme) {
    end = ParseContext::Previous(ctx);
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
  pSVar6 = typedefs.tail;
  pSVar8 = typedefs.head;
  pSVar5 = functions.tail;
  pSVar10 = functions.head;
  pSVar4 = accessors.tail;
  pSVar11 = accessors.head;
  pSVar3 = staticIfs.tail;
  pSVar9 = staticIfs.head;
  pSVar2 = members.tail;
  pSVar12 = members.head;
  pSVar1 = constantSets.tail;
  pSVar13 = constantSets.head;
  this = (SynClassElements *)CONCAT44(extraout_var,iVar7);
  SynBase::SynBase((SynBase *)this,0x3e,begin,end);
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00222a78;
  (this->typedefs).head = pSVar8;
  (this->typedefs).tail = pSVar6;
  (this->functions).head = pSVar10;
  (this->functions).tail = pSVar5;
  (this->accessors).head = pSVar11;
  (this->accessors).tail = pSVar4;
  (this->members).head = pSVar12;
  (this->members).tail = pSVar2;
  (this->constantSets).head = pSVar13;
  (this->constantSets).tail = pSVar1;
  (this->staticIfs).head = pSVar9;
  (this->staticIfs).tail = pSVar3;
  return this;
}

Assistant:

SynClassElements* ParseClassElements(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	IntrusiveList<SynTypedef> typedefs;
	IntrusiveList<SynFunctionDefinition> functions;
	IntrusiveList<SynAccessor> accessors;
	IntrusiveList<SynVariableDefinitions> members;
	IntrusiveList<SynConstantSet> constantSets;
	IntrusiveList<SynClassStaticIf> staticIfs;

	for(;;)
	{
		if(SynTypedef *node = ParseTypedef(ctx))
		{
			typedefs.push_back(node);
		}
		else if(SynClassStaticIf *node = ParseClassStaticIf(ctx, false))
		{
			staticIfs.push_back(node);
		}
		else if(SynFunctionDefinition *node = ParseFunctionDefinition(ctx))
		{
			functions.push_back(node);
		}
		else if(SynAccessor *node = ParseAccessorDefinition(ctx))
		{
			accessors.push_back(node);
		}
		else if(SynVariableDefinitions *node = ParseVariableDefinitions(ctx, true))
		{
			members.push_back(node);
		}
		else if(SynConstantSet *node = ParseConstantSet(ctx))
		{
			constantSets.push_back(node);
		}
		else
		{
			break;
		}
	}

	Lexeme *end = start == ctx.currentLexeme ? start : ctx.Previous();

	return new (ctx.get<SynClassElements>()) SynClassElements(start, end, typedefs, functions, accessors, members, constantSets, staticIfs);
}